

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O1

void Nf_ManComputeMappingEla(Nf_Man_t *p)

{
  uint *puVar1;
  Gia_Obj_t *pGVar2;
  undefined8 uVar3;
  int *piVar4;
  Nf_Obj_t *pNVar5;
  void *pvVar6;
  Mio_Cell2_t *pMVar7;
  Gia_Man_t *pGVar8;
  Vec_Int_t *pVVar9;
  int *piVar10;
  uint uVar11;
  long lVar12;
  long lVar13;
  word wVar14;
  word wVar15;
  byte bVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  Nf_Mat_t *pNVar24;
  undefined1 *puVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  Nf_Mat_t *pNVar30;
  undefined1 *puVar31;
  bool bVar32;
  Nf_Mat_t Mb;
  Nf_Mat_t local_40;
  
  Nf_ManSetOutputRequireds(p,1);
  Nf_ManResetMatches(p,p->Iter - p->pPars->nRounds);
  lVar12 = (long)p->pGia->nObjs;
  if (1 < lVar12) {
    do {
      if (p->pGia->nObjs < lVar12) goto LAB_00732eee;
      pGVar2 = p->pGia->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      lVar18 = lVar12 + -1;
      pGVar2 = pGVar2 + lVar18;
      uVar3 = *(undefined8 *)pGVar2;
      uVar11 = (uint)uVar3;
      if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
        uVar26 = lVar18 * 2;
        iVar20 = (int)lVar18;
        if ((((int)uVar11 < 0) || ((uVar11 & 0x1fffffff) == 0x1fffffff)) ||
           ((uVar11 & 0x1fffffff) != ((uint)((ulong)uVar3 >> 0x20) & 0x1fffffff))) {
          lVar28 = 0;
          do {
            lVar13 = (uVar26 & 0xffffffff) + lVar28;
            if ((p->vMapRefs).nSize <= (int)lVar13) goto LAB_00732e15;
            if ((p->vMapRefs).pArray[lVar13] != 0) {
              pNVar5 = p->pNfObjs;
              uVar11 = *(uint *)pNVar5[lVar18].M[lVar28];
              uVar21 = *(uint *)(pNVar5[lVar18].M[lVar28] + 1);
              if (-1 < (int)(uVar21 ^ uVar11)) {
LAB_00732e34:
                __assert_fail("pD->fBest != pA->fBest",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                              ,0x57b,"Nf_Mat_t *Nf_ObjMatchBest(Nf_Man_t *, int, int)");
              }
              pNVar24 = (Nf_Mat_t *)0x0;
              if ((int)uVar11 < 0) {
                pNVar24 = pNVar5[lVar18].M[lVar28];
              }
              if ((int)uVar21 < 0) {
                pNVar24 = pNVar5[lVar18].M[lVar28] + 1;
              }
              if ((p->vRequired).nSize <= (int)lVar13) goto LAB_00732e15;
              iVar17 = (p->vRequired).pArray[lVar13];
              if (iVar17 < pNVar24->D) {
                __assert_fail("pM->D <= Required",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                              ,0x7aa,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
              }
              if ((pNVar24->field_0x3 & 0x40) == 0) {
                iVar22 = (int)lVar28;
                wVar14 = Nf_MatchDeref_rec(p,iVar20,iVar22,pNVar24);
                if (-1 < *(int *)pNVar24) {
                  __assert_fail("pM->fBest",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x7b0,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                Nf_ManElaBestMatch(p,iVar20,iVar22,&local_40,iVar17);
                wVar15 = Nf_MatchRef_rec(p,iVar20,iVar22,&local_40,iVar17,(Vec_Int_t *)0x0);
                if (-1 < (int)local_40._0_4_) {
                  __assert_fail("pMb->fBest",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x7c1,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                if (iVar17 < local_40.D) {
                  __assert_fail("pMb->D <= Required",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x7c2,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                if (wVar14 < wVar15) {
                  __assert_fail("AreaBef >= AreaAft",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x7c4,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                }
                *(ulong *)pNVar24 = CONCAT44(local_40.Cfg,local_40._0_4_);
                pNVar24->D = local_40.D;
                pNVar24->F = local_40.F;
                if ((p->vCutSets).nSize < lVar12) goto LAB_00732e15;
                uVar11 = (p->vCutSets).pArray[lVar18];
                uVar21 = (int)uVar11 >> 0x10;
                if (((int)uVar21 < 0) || ((p->vPages).nSize <= (int)uVar21)) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                }
                uVar23 = (uint)local_40._0_4_ >> 0x14 & 0x3ff;
                if (uVar23 == 0) {
                  __assert_fail("h > 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                ,0x93,"int *Nf_CutFromHandle(int *, int)");
                }
                uVar11 = uVar11 & 0xffff;
                pvVar6 = (p->vPages).pArray[uVar21];
                if ((*(byte *)((long)pvVar6 + (ulong)uVar23 * 4 + (ulong)uVar11 * 4) & 0x1f) != 0) {
                  pMVar7 = p->pCells;
                  puVar1 = (uint *)((long)pvVar6 + (ulong)uVar23 * 4 + (ulong)uVar11 * 4);
                  lVar13 = (ulong)((local_40._0_4_ & 0xfffff) * 0x50) + 0x2c;
                  bVar16 = 0;
                  uVar19 = 0;
                  do {
                    uVar11 = puVar1[(ulong)(((uint)local_40.Cfg >> 8) >> (bVar16 & 0x1f) & 0xf) + 1]
                    ;
                    lVar27 = (long)(int)uVar11;
                    if (lVar27 == 0) break;
                    bVar32 = (((uint)local_40.Cfg >> 1 & 0x7f) >> ((uint)uVar19 & 0x1f) & 1) != 0;
                    pNVar5 = p->pNfObjs;
                    uVar21 = *(uint *)pNVar5[lVar27].M[bVar32];
                    uVar23 = *(uint *)(pNVar5[lVar27].M[bVar32] + 1);
                    if (-1 < (int)(uVar23 ^ uVar21)) goto LAB_00732e34;
                    if ((int)uVar21 < 0) {
                      pNVar24 = pNVar5[lVar27].M[bVar32];
                    }
                    else {
                      pNVar24 = (Nf_Mat_t *)0x0;
                    }
                    pNVar30 = pNVar5[lVar27].M[bVar32] + 1;
                    if (-1 < (int)uVar23) {
                      pNVar30 = pNVar24;
                    }
                    iVar22 = iVar17 - *(int *)((long)pMVar7->iDelays + uVar19 * 4 + lVar13 + -0x2c);
                    if (iVar22 < ((Nf_Mat_t *)&pNVar30->field_0x0)->D) {
                      __assert_fail("pM->D <= Required - pCell->iDelays[k]",
                                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                    ,0x7cc,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                    }
                    if ((int)uVar11 < 0) goto LAB_00732e53;
                    uVar21 = (uint)bVar32 + uVar11 * 2;
                    if ((p->vRequired).nSize <= (int)uVar21) goto LAB_00732e15;
                    piVar4 = (p->vRequired).pArray;
                    if (iVar22 < piVar4[uVar21]) {
                      piVar4[uVar21] = iVar22;
                    }
                    if ((((Nf_Mat_t *)&pNVar30->field_0x0)->field_0x3 & 0x40) != 0) {
                      uVar29 = (bVar32 ^ 1) << 5;
                      uVar21 = *(uint *)(&pNVar5[lVar27].M[0][0].field_0x0 + uVar29);
                      uVar23 = *(uint *)(&pNVar5[lVar27].M[0][1].field_0x0 + uVar29);
                      if (-1 < (int)(uVar23 ^ uVar21)) goto LAB_00732e34;
                      if ((int)uVar21 < 0) {
                        puVar25 = &pNVar5[lVar27].M[0][0].field_0x0 + uVar29;
                      }
                      else {
                        puVar25 = (undefined1 *)0x0;
                      }
                      puVar31 = &pNVar5[lVar27].M[0][1].field_0x0 + uVar29;
                      if (-1 < (int)uVar23) {
                        puVar31 = puVar25;
                      }
                      iVar22 = iVar17 - (*(int *)((long)pMVar7->iDelays +
                                                 uVar19 * 4 + lVar13 + -0x2c) + p->InvDelayI);
                      if (iVar22 < *(int *)(puVar31 + 8)) {
                        __assert_fail("pM->D <= Required - pCell->iDelays[k] - p->InvDelayI",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaNf.c"
                                      ,0x7d1,"void Nf_ManComputeMappingEla(Nf_Man_t *)");
                      }
                      uVar11 = bVar32 ^ 1 | uVar11 * 2;
                      if ((p->vRequired).nSize <= (int)uVar11) goto LAB_00732e15;
                      if (iVar22 < piVar4[uVar11]) {
                        piVar4[uVar11] = iVar22;
                      }
                    }
                    uVar19 = uVar19 + 1;
                    bVar16 = bVar16 + 4;
                  } while (uVar19 < (*puVar1 & 0x1f));
                }
              }
            }
            bVar32 = lVar28 == 0;
            lVar28 = lVar28 + 1;
          } while (bVar32);
        }
        else {
          uVar19 = uVar26 | 1;
          if ((long)(p->vMapRefs).nSize <= (long)uVar19) goto LAB_00732e15;
          if ((p->vMapRefs).pArray[uVar19] != 0) {
            if ((long)(p->vRequired).nSize <= (long)uVar19) goto LAB_00732e15;
            piVar4 = (p->vRequired).pArray;
            iVar17 = piVar4[uVar19] - p->InvDelayI;
            if (iVar17 < piVar4[lVar18 * 2]) {
              piVar4[lVar18 * 2] = iVar17;
            }
          }
          iVar17 = (p->vRequired).nSize;
          if ((long)iVar17 <= (long)uVar26) goto LAB_00732e15;
          uVar11 = *(uint *)pGVar2;
          iVar20 = iVar20 - (uVar11 & 0x1fffffff);
          if (iVar20 < 0) {
LAB_00732e53:
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf1,"int Abc_Var2Lit(int, int)");
          }
          uVar11 = (uVar11 >> 0x1d & 1) + iVar20 * 2;
          if (iVar17 <= (int)uVar11) goto LAB_00732e15;
          piVar4 = (p->vRequired).pArray;
          if (piVar4[lVar18 * 2] < piVar4[uVar11]) {
            piVar4[uVar11] = piVar4[lVar18 * 2];
          }
        }
      }
      bVar32 = 2 < lVar12;
      lVar12 = lVar18;
    } while (bVar32);
  }
  pGVar8 = p->pGia;
  pVVar9 = pGVar8->vCis;
  if (0 < pVVar9->nSize) {
    piVar4 = pVVar9->pArray;
    iVar20 = 1;
    lVar12 = 0;
    do {
      uVar11 = piVar4[lVar12];
      uVar26 = (ulong)uVar11;
      if (((int)uVar11 < 0) || (pGVar8->nObjs <= (int)uVar11)) {
LAB_00732eee:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (uVar26 == 0) {
        return;
      }
      lVar18 = uVar26 * 2 + 1;
      if ((p->vMapRefs).nSize <= (int)lVar18) goto LAB_00732e15;
      if ((p->vMapRefs).pArray[lVar18] != 0) {
        iVar17 = (p->vRequired).nSize;
        if ((iVar17 <= iVar20) || (iVar17 <= (int)(uVar26 * 2))) {
LAB_00732e15:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                        ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar10 = (p->vRequired).pArray;
        iVar17 = piVar10[lVar12 * 2 + 1] - p->InvDelayI;
        uVar26 = uVar26 * 2 & 0xffffffff;
        if (iVar17 < piVar10[uVar26]) {
          piVar10[uVar26] = iVar17;
        }
      }
      lVar12 = lVar12 + 1;
      iVar20 = iVar20 + 2;
    } while (lVar12 < pVVar9->nSize);
  }
  return;
}

Assistant:

void Nf_ManComputeMappingEla( Nf_Man_t * p )
{
    int fVerbose = 0;
    Gia_Obj_t * pObj;
    Mio_Cell2_t * pCell;
    Nf_Mat_t Mb, * pMb = &Mb, * pM;
    word AreaBef, AreaAft, Gain = 0;
    int i, c, iVar, Id, fCompl, k, * pCut;
    int Required;
    Nf_ManSetOutputRequireds( p, 1 );
    Nf_ManResetMatches( p, p->Iter - p->pPars->nRounds );
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        if ( Gia_ObjIsBuf(pObj) )
        {
            if ( Nf_ObjMapRefNum(p, i, 1) )
                Nf_ObjUpdateRequired( p, i, 0, Nf_ObjRequired(p, i, 1) - p->InvDelayI );
            Nf_ObjUpdateRequired( p, Gia_ObjFaninId0(pObj, i), Gia_ObjFaninC0(pObj), Nf_ObjRequired(p, i, 0) );
            continue;
        }
        for ( c = 0; c < 2; c++ )
        if ( Nf_ObjMapRefNum(p, i, c) )
        {
            pM = Nf_ObjMatchBest( p, i, c );
            Required = Nf_ObjRequired( p, i, c );
            assert( pM->D <= Required );
            if ( pM->fCompl )
                continue;
            // search for a better match
            assert( !pM->fCompl );
            AreaBef = Nf_MatchDeref_rec( p, i, c, pM );
            assert( pM->fBest );
            Nf_ManElaBestMatch( p, i, c, pMb, Required );
            AreaAft = Nf_MatchRef_rec( p, i, c, pMb, Required, NULL );
            Gain += AreaBef - AreaAft;
            // print area recover progress
            if ( fVerbose && Nf_ManCell(p, pM->Gate)->pName != Nf_ManCell(p, pMb->Gate)->pName )
            {
                printf( "%4d (%d)  ", i, c );
                printf( "%8s ->%8s  ",         Nf_ManCell(p, pM->Gate)->pName, Nf_ManCell(p, pMb->Gate)->pName );
                printf( "%d -> %d  ",          Nf_ManCell(p, pM->Gate)->nFanins, Nf_ManCell(p, pMb->Gate)->nFanins );
                printf( "D: %7.2f -> %7.2f  ", Scl_Int2Flt(pM->D), Scl_Int2Flt(pMb->D) );
                printf( "R: %7.2f  ",          Required == SCL_INFINITY ? 9999.99 : Scl_Int2Flt(Required) );
                printf( "A: %7.2f -> %7.2f  ", Scl_Int2Flt((int)AreaBef), Scl_Int2Flt((int)AreaAft) );
                printf( "G: %7.2f (%7.2f) ",   Scl_Int2Flt((int)AreaBef - (int)AreaAft), Scl_Int2Flt((int)Gain) );
                printf( "\n" );
            }
            // set best match
            assert( pMb->fBest );
            assert( pMb->D <= Required );
            //assert( Scl_Flt2Int(pMb->F) == (int)AreaAft );
            assert( AreaBef >= AreaAft );
            *pM = *pMb;
            // update timing
            pCell = Nf_ManCell( p, pMb->Gate );
            pCut = Nf_CutFromHandle( Nf_ObjCutSet(p, i), pMb->CutH );
            Nf_CutForEachVarCompl( pCut, pMb->Cfg, iVar, fCompl, k )
            {
                pM = Nf_ObjMatchBest( p, iVar, fCompl );
                assert( pM->D <= Required - pCell->iDelays[k] );
                Nf_ObjUpdateRequired( p, iVar, fCompl, Required - pCell->iDelays[k] );
                if ( pM->fCompl )
                {
                    pM = Nf_ObjMatchBest( p, iVar, !fCompl );
                    assert( pM->D <= Required - pCell->iDelays[k] - p->InvDelayI );
                    Nf_ObjUpdateRequired( p, iVar, !fCompl, Required - pCell->iDelays[k] - p->InvDelayI );
                }
            }
        }
    }
    Gia_ManForEachCiId( p->pGia, Id, i )
        if ( Nf_ObjMapRefNum(p, Id, 1) )
        {
            Required = Nf_ObjRequired( p, i, 1 );
            Nf_ObjUpdateRequired( p, Id, 0, Required - p->InvDelayI );
        }
}